

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O0

bool __thiscall QEvdevTabletHandler::queryLimits(QEvdevTabletHandler *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  bool ok;
  input_absinfo absInfo;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  char name [128];
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  undefined7 in_stack_fffffffffffffe38;
  byte bVar5;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *this_00;
  char local_1b8 [32];
  storage_type *local_198;
  undefined1 local_188 [24];
  char local_170 [32];
  char local_150 [32];
  char local_130 [32];
  char local_110 [32];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  ulong local_d0;
  undefined8 local_c8;
  ulong local_c0;
  undefined8 local_b8;
  ulong local_b0;
  undefined8 local_a8;
  ulong local_a0;
  undefined8 local_98;
  ulong local_90;
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = 1;
  local_f0 = 0xaaaaaaaaaaaaaaaa;
  local_e8 = 0xaaaaaaaaaaaaaaaa;
  local_e0 = 0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  memset(&local_f0,0,0x18);
  iVar2 = ioctl(*(int *)&in_RDI[1].category,0x80184540,&local_f0);
  bVar5 = (bVar5 & 1 & -1 < iVar2) != 0;
  if ((bool)bVar5) {
    *(undefined4 *)(*(long *)&in_RDI[3].control + 0x28) = local_f0._4_4_;
    *(undefined4 *)(*(long *)&in_RDI[3].control + 0x38) = (undefined4)local_e8;
    local_98 = 0xaaaaaaaaaaaaaaaa;
    local_90 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEvdevTablet();
    anon_unknown.dwarf_5679f::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (in_RDI,(QLoggingCategory *)
                      CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_98), bVar1) {
      anon_unknown.dwarf_5679f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x10f1ce);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)CONCAT17(bVar5,in_stack_fffffffffffffe38),
                 (int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (char *)0x10f1e7);
      QtPrivate::asString((QString *)&in_RDI[1].control);
      uVar3 = QString::utf16();
      QMessageLogger::debug
                (local_110,"evdevtablet: %ls: min X: %d max X: %d",uVar3,
                 (ulong)*(uint *)(*(long *)&in_RDI[3].control + 0x28),
                 (ulong)*(uint *)(*(long *)&in_RDI[3].control + 0x38));
      local_90 = local_90 & 0xffffffffffffff00;
    }
  }
  iVar2 = ioctl(*(int *)&in_RDI[1].category,0x80184541,&local_f0);
  bVar5 = (bVar5 & 1 & -1 < iVar2) != 0;
  if ((bool)bVar5) {
    *(undefined4 *)(*(long *)&in_RDI[3].control + 0x2c) = local_f0._4_4_;
    *(undefined4 *)(*(long *)&in_RDI[3].control + 0x3c) = (undefined4)local_e8;
    local_a8 = 0xaaaaaaaaaaaaaaaa;
    local_a0 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEvdevTablet();
    anon_unknown.dwarf_5679f::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (in_RDI,(QLoggingCategory *)
                      CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_a8), bVar1) {
      anon_unknown.dwarf_5679f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x10f2f6);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)CONCAT17(bVar5,in_stack_fffffffffffffe38),
                 (int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (char *)0x10f30f);
      QtPrivate::asString((QString *)&in_RDI[1].control);
      uVar3 = QString::utf16();
      QMessageLogger::debug
                (local_130,"evdevtablet: %ls: min Y: %d max Y: %d",uVar3,
                 (ulong)*(uint *)(*(long *)&in_RDI[3].control + 0x2c),
                 (ulong)*(uint *)(*(long *)&in_RDI[3].control + 0x3c));
      local_a0 = local_a0 & 0xffffffffffffff00;
    }
  }
  iVar2 = ioctl(*(int *)&in_RDI[1].category,0x80184558,&local_f0);
  if (-1 < iVar2) {
    *(undefined4 *)(*(long *)&in_RDI[3].control + 0x30) = local_f0._4_4_;
    *(undefined4 *)(*(long *)&in_RDI[3].control + 0x40) = (undefined4)local_e8;
    local_b8 = 0xaaaaaaaaaaaaaaaa;
    local_b0 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEvdevTablet();
    anon_unknown.dwarf_5679f::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (in_RDI,(QLoggingCategory *)
                      CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_b8), bVar1) {
      anon_unknown.dwarf_5679f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x10f3fa);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)CONCAT17(bVar5,in_stack_fffffffffffffe38),
                 (int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (char *)0x10f413);
      QtPrivate::asString((QString *)&in_RDI[1].control);
      uVar3 = QString::utf16();
      QMessageLogger::debug
                (local_150,"evdevtablet: %ls: min pressure: %d max pressure: %d",uVar3,
                 (ulong)*(uint *)(*(long *)&in_RDI[3].control + 0x30),
                 (ulong)*(uint *)(*(long *)&in_RDI[3].control + 0x40));
      local_b0 = local_b0 & 0xffffffffffffff00;
    }
  }
  iVar2 = ioctl(*(int *)&in_RDI[1].category,0x80184559,&local_f0);
  if (-1 < iVar2) {
    *(undefined4 *)(*(long *)&in_RDI[3].control + 0x34) = local_f0._4_4_;
    *(undefined4 *)(*(long *)&in_RDI[3].control + 0x44) = (undefined4)local_e8;
    local_c8 = 0xaaaaaaaaaaaaaaaa;
    local_c0 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEvdevTablet();
    anon_unknown.dwarf_5679f::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (in_RDI,(QLoggingCategory *)
                      CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_c8), bVar1) {
      anon_unknown.dwarf_5679f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x10f4fe);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)CONCAT17(bVar5,in_stack_fffffffffffffe38),
                 (int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (char *)0x10f514);
      QtPrivate::asString((QString *)&in_RDI[1].control);
      uVar3 = QString::utf16();
      QMessageLogger::debug
                (local_170,"evdevtablet: %ls: min distance: %d max distance: %d",uVar3,
                 (ulong)*(uint *)(*(long *)&in_RDI[3].control + 0x34),
                 (ulong)*(uint *)(*(long *)&in_RDI[3].control + 0x44));
      local_c0 = local_c0 & 0xffffffffffffff00;
    }
  }
  memset(local_88,0xaa,0x80);
  iVar2 = ioctl(*(int *)&in_RDI[1].category,0x807f4506,local_88);
  if (-1 < iVar2) {
    QByteArrayView::QByteArrayView<128ul>
              ((QByteArrayView *)this_00,(char (*) [128])CONCAT17(bVar5,in_stack_fffffffffffffe38));
    QVar4.m_data = local_198;
    QVar4.m_size = (qsizetype)local_188;
    QString::fromLocal8Bit(QVar4);
    QString::operator=((QString *)in_RDI,
                       (QString *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    QString::~QString((QString *)0x10f5e3);
    local_d8 = 0xaaaaaaaaaaaaaaaa;
    local_d0 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEvdevTablet();
    anon_unknown.dwarf_5679f::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (in_RDI,(QLoggingCategory *)
                      CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_d8), bVar1) {
      anon_unknown.dwarf_5679f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x10f636);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)CONCAT17(bVar5,in_stack_fffffffffffffe38),
                 (int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (char *)0x10f64c);
      QtPrivate::asString((QString *)&in_RDI[1].control);
      uVar3 = QString::utf16();
      QMessageLogger::debug(local_1b8,"evdevtablet: %ls: device name: %s",uVar3,local_88);
      local_d0 = local_d0 & 0xffffffffffffff00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool QEvdevTabletHandler::queryLimits()
{
    bool ok = true;
    input_absinfo absInfo;
    memset(&absInfo, 0, sizeof(input_absinfo));
    ok &= ioctl(m_fd, EVIOCGABS(ABS_X), &absInfo) >= 0;
    if (ok) {
        d->minValues.x = absInfo.minimum;
        d->maxValues.x = absInfo.maximum;
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: min X: %d max X: %d", qUtf16Printable(m_device),
                d->minValues.x, d->maxValues.x);
    }
    ok &= ioctl(m_fd, EVIOCGABS(ABS_Y), &absInfo) >= 0;
    if (ok) {
        d->minValues.y = absInfo.minimum;
        d->maxValues.y = absInfo.maximum;
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: min Y: %d max Y: %d", qUtf16Printable(m_device),
                d->minValues.y, d->maxValues.y);
    }
    if (ioctl(m_fd, EVIOCGABS(ABS_PRESSURE), &absInfo) >= 0) {
        d->minValues.p = absInfo.minimum;
        d->maxValues.p = absInfo.maximum;
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: min pressure: %d max pressure: %d", qUtf16Printable(m_device),
                d->minValues.p, d->maxValues.p);
    }
    if (ioctl(m_fd, EVIOCGABS(ABS_DISTANCE), &absInfo) >= 0) {
        d->minValues.d = absInfo.minimum;
        d->maxValues.d = absInfo.maximum;
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: min distance: %d max distance: %d", qUtf16Printable(m_device),
                d->minValues.d, d->maxValues.d);
    }
    char name[128];
    if (ioctl(m_fd, EVIOCGNAME(sizeof(name) - 1), name) >= 0) {
        d->devName = QString::fromLocal8Bit(name);
        qCDebug(qLcEvdevTablet, "evdevtablet: %ls: device name: %s", qUtf16Printable(m_device), name);
    }
    return ok;
}